

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O0

void __thiscall
BayesianGameCollaborativeGraphical::~BayesianGameCollaborativeGraphical
          (BayesianGameCollaborativeGraphical *this)

{
  vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_> *this_00;
  vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_> *pvVar1;
  reference ppBVar2;
  undefined8 *in_RDI;
  Index i;
  size_type in_stack_ffffffffffffffc8;
  value_type in_stack_ffffffffffffffd0;
  uint local_c;
  
  *in_RDI = &PTR__BayesianGameCollaborativeGraphical_00d067e8;
  local_c = 0;
  while( true ) {
    this_00 = (vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
               *)(ulong)local_c;
    pvVar1 = (vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
              *)std::
                vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                ::size((vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                        *)(in_RDI + 0x1c));
    if (this_00 == pvVar1) break;
    ppBVar2 = std::
              vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
              ::at((vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                    *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 = *ppBVar2;
    if (in_stack_ffffffffffffffd0 != (value_type)0x0) {
      (*(in_stack_ffffffffffffffd0->super_BayesianGameIdenticalPayoffInterface).
        super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
        super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[1])();
    }
    local_c = local_c + 1;
  }
  if ((in_RDI[0x22] != 0) && ((long *)in_RDI[0x22] != (long *)0x0)) {
    (**(code **)(*(long *)in_RDI[0x22] + 8))();
  }
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)this_00);
  std::vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>::
  ~vector(this_00);
  BayesianGameIdenticalPayoffInterface::~BayesianGameIdenticalPayoffInterface
            ((BayesianGameIdenticalPayoffInterface *)0x8b0388);
  return;
}

Assistant:

BayesianGameCollaborativeGraphical::~BayesianGameCollaborativeGraphical()
{
    for(Index i=0;i!=_m_LRFs.size();++i)
        delete _m_LRFs.at(i);

    if(_m_jt_pd)
        delete _m_jt_pd;
}